

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CreateEvaluationSourceFiles(cmGlobalGenerator *this,string *config)

{
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<cmGeneratorExpressionEvaluationFile_*const_*,_std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>_>
  local_28;
  __normal_iterator<cmGeneratorExpressionEvaluationFile_*const_*,_std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>_>
  local_20;
  const_iterator li;
  string *config_local;
  cmGlobalGenerator *this_local;
  
  li._M_current = (cmGeneratorExpressionEvaluationFile **)config;
  local_20._M_current =
       (cmGeneratorExpressionEvaluationFile **)
       std::
       vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
       ::begin(&this->EvaluationFiles);
  while( true ) {
    local_28._M_current =
         (cmGeneratorExpressionEvaluationFile **)
         std::
         vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
         ::end(&this->EvaluationFiles);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmGeneratorExpressionEvaluationFile_*const_*,_std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>_>
              ::operator*(&local_20);
    cmGeneratorExpressionEvaluationFile::CreateOutputFile(*ppcVar2,(string *)li._M_current);
    __gnu_cxx::
    __normal_iterator<cmGeneratorExpressionEvaluationFile_*const_*,_std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateEvaluationSourceFiles(
                                              std::string const& config) const
{
  for(std::vector<cmGeneratorExpressionEvaluationFile*>::const_iterator
      li = this->EvaluationFiles.begin();
      li != this->EvaluationFiles.end();
      ++li)
    {
    (*li)->CreateOutputFile(config);
    }
}